

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicGeometryShaderTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::geometry::anon_unknown_0::VaryingOutputCountCase::createInstance
          (VaryingOutputCountCase *this,Context *context)

{
  VaryingSource VVar1;
  ShaderInstancingMode SVar2;
  int iVar3;
  GeometryExpanderRenderTestInstance *this_00;
  pointer pVVar4;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *this_01;
  uint uVar5;
  
  this_00 = (GeometryExpanderRenderTestInstance *)operator_new(0x170);
  VVar1 = this->m_test;
  SVar2 = this->m_mode;
  GeometryExpanderRenderTestInstance::GeometryExpanderRenderTestInstance
            (this_00,context,VK_PRIMITIVE_TOPOLOGY_POINT_LIST,
             (this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__VaryingOutputCountTestInstance_00d7e358;
  *(VaryingSource *)&this_00[1].super_TestInstance._vptr_TestInstance = VVar1;
  *(ShaderInstancingMode *)((long)&this_00[1].super_TestInstance._vptr_TestInstance + 4) = SVar2;
  *(undefined4 *)&this_00[1].super_TestInstance.m_context = 0x80;
  memset(&this_00[1].m_primitiveType,0,0xe8);
  if (SVar2 == MODE_WITH_INSTANCING) {
    this_00->m_numDrawVertices = 1;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              (&this_00->m_vertexPosData,1);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              (&this_00->m_vertexAttrData,(long)this_00->m_numDrawVertices);
    pVVar4 = (this_00->m_vertexPosData).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pVVar4->m_data[0] = 0.0;
    pVVar4->m_data[1] = 0.0;
    pVVar4->m_data[2] = 0.0;
    pVVar4->m_data[3] = 1.0;
    if (*(int *)&this_00[1].super_TestInstance._vptr_TestInstance == 0) {
      iVar3 = *(int *)&this_00[1].super_TestInstance.m_context;
      pVVar4 = (this_00->m_vertexAttrData).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar4->m_data[0] = 6.0;
      pVVar4->m_data[1] = 0.0;
      pVVar4->m_data[2] = (float)iVar3;
      pVVar4->m_data[3] = 10.0;
    }
    else {
      pVVar4 = (this_00->m_vertexAttrData).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar4->m_data[0] = 0.0;
      pVVar4->m_data[1] = 0.0;
      pVVar4->m_data[2] = 0.0;
      pVVar4->m_data[3] = 0.0;
    }
  }
  else if (SVar2 == MODE_WITHOUT_INSTANCING) {
    this_00->m_numDrawVertices = 4;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              (&this_00->m_vertexPosData,4);
    this_01 = &this_00->m_vertexAttrData;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              (this_01,(long)this_00->m_numDrawVertices);
    pVVar4 = (this_00->m_vertexPosData).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pVVar4->m_data[0] = 0.5;
    pVVar4->m_data[1] = 0.0;
    pVVar4->m_data[2] = 0.0;
    pVVar4->m_data[3] = 1.0;
    pVVar4 = (this_00->m_vertexPosData).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pVVar4[1].m_data[0] = 0.0;
    pVVar4[1].m_data[1] = 0.5;
    pVVar4[1].m_data[2] = 0.0;
    pVVar4[1].m_data[3] = 1.0;
    pVVar4 = (this_00->m_vertexPosData).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pVVar4[2].m_data[0] = -0.7;
    pVVar4[2].m_data[1] = -0.1;
    pVVar4[2].m_data[2] = 0.0;
    pVVar4[2].m_data[3] = 1.0;
    pVVar4 = (this_00->m_vertexPosData).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pVVar4[3].m_data[0] = -0.1;
    pVVar4[3].m_data[1] = -0.7;
    pVVar4[3].m_data[2] = 0.0;
    pVVar4[3].m_data[3] = 1.0;
    pVVar4 = (this_00->m_vertexAttrData).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (*(int *)&this_00[1].super_TestInstance._vptr_TestInstance == 0) {
      pVVar4->m_data[0] = 6.0;
      pVVar4->m_data[1] = 0.0;
      pVVar4->m_data[2] = 0.0;
      pVVar4->m_data[3] = 0.0;
      pVVar4 = (this_00->m_vertexAttrData).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar4[1].m_data[0] = 0.0;
      pVVar4[1].m_data[1] = 0.0;
      pVVar4[1].m_data[2] = 0.0;
      pVVar4[1].m_data[3] = 0.0;
      pVVar4 = (this_00->m_vertexAttrData).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar4[2].m_data[0] = (float)*(int *)&this_00[1].super_TestInstance.m_context;
      pVVar4[2].m_data[1] = 0.0;
      pVVar4[2].m_data[2] = 0.0;
      pVVar4[2].m_data[3] = 0.0;
      pVVar4 = (this_00->m_vertexAttrData).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = 0x41200000;
    }
    else {
      pVVar4->m_data[0] = 0.0;
      pVVar4->m_data[1] = 0.0;
      pVVar4->m_data[2] = 0.0;
      pVVar4->m_data[3] = 0.0;
      pVVar4 = (this_01->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pVVar4[1].m_data[0] = 1.0;
      pVVar4[1].m_data[1] = 0.0;
      pVVar4[1].m_data[2] = 0.0;
      pVVar4[1].m_data[3] = 0.0;
      pVVar4 = (this_01->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pVVar4[2].m_data[0] = 2.0;
      pVVar4[2].m_data[1] = 0.0;
      pVVar4[2].m_data[2] = 0.0;
      pVVar4[2].m_data[3] = 0.0;
      pVVar4 = (this_01->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = 0x40400000;
    }
    *(undefined1 (*) [16])pVVar4[3].m_data = ZEXT416(uVar5);
  }
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* VaryingOutputCountCase::createInstance (Context& context) const
{
	return new VaryingOutputCountTestInstance (context, getName(), VK_PRIMITIVE_TOPOLOGY_POINT_LIST, m_test, m_mode);
}